

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::BuildSkelHierarchy(Skeleton *skel,SkelNode *dst,string *err)

{
  pointer pmVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  pointer pmVar5;
  reference pvVar6;
  reference this;
  size_type sVar7;
  iterator iVar8;
  iterator iVar9;
  string *psVar10;
  reference pvVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> local_1a20;
  int *local_1a08;
  int *local_1a00;
  size_type local_19f8;
  size_t rootIdx;
  ostringstream local_19d0 [8];
  ostringstream ss_e_11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1858;
  int local_184c;
  int *local_1848;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1840;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1838;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> it;
  SkelNode root;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> visitSet;
  allocator local_1679;
  string local_1678 [32];
  string local_1658;
  ostringstream local_1638 [8];
  ostringstream ss_e_10;
  string local_14c0 [39];
  allocator local_1499;
  string local_1498 [32];
  fmt local_1478 [32];
  ostringstream local_1458 [8];
  ostringstream ss_e_9;
  undefined1 local_12c8 [8];
  difference_type nroots;
  vector<int,_std::allocator<int>_> parentJointIds;
  size_type local_1288;
  undefined1 local_1280 [16];
  string local_1270 [32];
  string local_1250;
  ostringstream local_1230 [8];
  ostringstream ss_e_8;
  value_type local_10b8;
  string local_1038 [39];
  allocator local_1011;
  string local_1010 [32];
  fmt local_ff0 [32];
  ostringstream local_fd0 [8];
  ostringstream ss_e_7;
  undefined1 local_e58 [8];
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> bindTransforms;
  size_type local_e20;
  undefined1 local_e18 [16];
  string local_e08 [32];
  string local_de8;
  ostringstream local_dc8 [8];
  ostringstream ss_e_6;
  value_type local_c50;
  string local_bd0 [39];
  allocator local_ba9;
  string local_ba8 [32];
  fmt local_b88 [32];
  ostringstream local_b68 [8];
  ostringstream ss_e_5;
  undefined1 local_9f0 [8];
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> restTransforms;
  size_t i;
  size_type local_9b0;
  undefined1 local_9a8 [16];
  string local_998 [32];
  string local_978;
  ostringstream local_958 [8];
  ostringstream ss_e_4;
  string local_7e0 [39];
  allocator local_7b9;
  string local_7b8 [32];
  fmt local_798 [32];
  ostringstream local_778 [8];
  ostringstream ss_e_3;
  undefined1 local_600 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> jointNames;
  allocator local_5c1;
  string local_5c0 [32];
  fmt local_5a0 [32];
  ostringstream local_580 [8];
  ostringstream ss_e_2;
  string local_400 [39];
  allocator local_3d9;
  string local_3d8 [32];
  fmt local_3b8 [32];
  ostringstream local_398 [8];
  ostringstream ss_e_1;
  undefined1 local_220 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> joints;
  allocator local_1e1;
  string local_1e0 [32];
  fmt local_1c0 [32];
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  string *err_local;
  SkelNode *dst_local;
  Skeleton *skel_local;
  
  bVar2 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::authored
                    (&skel->joints);
  if (!bVar2) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    poVar3 = ::std::operator<<((ostream *)local_1a0,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"BuildSkelHierarchy");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb89);
    ::std::operator<<(poVar3," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_1e0,"Skeleton.joints attrbitue is not authored: {}",&local_1e1);
    fmt::format<std::__cxx11::string>
              (local_1c0,(string *)local_1e0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&skel->name);
    poVar3 = ::std::operator<<((ostream *)local_1a0,(string *)local_1c0);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::~string((string *)local_1c0);
    ::std::__cxx11::string::~string(local_1e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=
                ((string *)err,
                 (string *)
                 &joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    return false;
  }
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220);
  bVar2 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::get_value
                    (&skel->joints,
                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220);
  if (!bVar2) {
    ::std::__cxx11::ostringstream::ostringstream(local_398);
    poVar3 = ::std::operator<<((ostream *)local_398,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"BuildSkelHierarchy");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb8f);
    ::std::operator<<(poVar3," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_3d8,"Failed to get Skeleton.joints attrbitue: {}",&local_3d9);
    fmt::format<std::__cxx11::string>
              (local_3b8,(string *)local_3d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&skel->name);
    poVar3 = ::std::operator<<((ostream *)local_398,(string *)local_3b8);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::~string((string *)local_3b8);
    ::std::__cxx11::string::~string(local_3d8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_400);
      ::std::__cxx11::string::~string(local_400);
    }
    skel_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_398);
    goto LAB_004afe91;
  }
  bVar2 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::empty
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220);
  if (bVar2) {
    ::std::__cxx11::ostringstream::ostringstream(local_580);
    poVar3 = ::std::operator<<((ostream *)local_580,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"BuildSkelHierarchy");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb94);
    ::std::operator<<(poVar3," ");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_5c0,"Skeleton.joints attrbitue is empty: {}",&local_5c1);
    fmt::format<std::__cxx11::string>
              (local_5a0,(string *)local_5c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&skel->name);
    poVar3 = ::std::operator<<((ostream *)local_580,(string *)local_5a0);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::~string((string *)local_5a0);
    ::std::__cxx11::string::~string(local_5c0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=
                ((string *)err,
                 (string *)
                 &jointNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &jointNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    skel_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_580);
    goto LAB_004afe91;
  }
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_600);
  bVar2 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::authored
                    (&skel->jointNames);
  if (bVar2) {
    bVar2 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::
            get_value(&skel->jointNames,
                      (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_600);
    if (bVar2) {
      sVar4 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220);
      sVar7 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_600);
      if (sVar4 == sVar7) goto LAB_004af0ad;
      ::std::__cxx11::ostringstream::ostringstream(local_958);
      poVar3 = ::std::operator<<((ostream *)local_958,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"BuildSkelHierarchy");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xba3);
      ::std::operator<<(poVar3," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_998,
                 "Skeleton.joints.size {} must be equal to Skeleton.jointNames.size {}: {}",
                 (allocator *)(local_9a8 + 0xf));
      local_9a8._0_8_ =
           ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                     ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220);
      local_9b0 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_600)
      ;
      fmt::format<unsigned_long,unsigned_long,std::__cxx11::string>
                (&local_978,(fmt *)local_998,(string *)local_9a8,&local_9b0,
                 (unsigned_long *)&skel->name,in_R9);
      poVar3 = ::std::operator<<((ostream *)local_958,(string *)&local_978);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::~string((string *)&local_978);
      ::std::__cxx11::string::~string(local_998);
      ::std::allocator<char>::~allocator((allocator<char> *)(local_9a8 + 0xf));
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,(string *)&i);
        ::std::__cxx11::string::~string((string *)&i);
      }
      skel_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_958);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_778);
      poVar3 = ::std::operator<<((ostream *)local_778,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"BuildSkelHierarchy");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb9c);
      ::std::operator<<(poVar3," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_7b8,"Failed to get Skeleton.jointNames attrbitue: {}",&local_7b9);
      fmt::format<std::__cxx11::string>
                (local_798,(string *)local_7b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&skel->name);
      poVar3 = ::std::operator<<((ostream *)local_778,(string *)local_798);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::~string((string *)local_798);
      ::std::__cxx11::string::~string(local_7b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_7e0);
        ::std::__cxx11::string::~string(local_7e0);
      }
      skel_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_778);
    }
  }
  else {
    sVar4 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::resize
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_600,sVar4);
    for (restTransforms.
         super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pmVar1 = restTransforms.
                 super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
        pmVar5 = (pointer)::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                     local_220), pmVar1 < pmVar5;
        restTransforms.
        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)(restTransforms.
                              super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->m[0] + 1)) {
      pvVar6 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                         ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220,
                          (size_type)
                          restTransforms.
                          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                       ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_600,
                        (size_type)
                        restTransforms.
                        super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Token::operator=(this,pvVar6);
    }
LAB_004af0ad:
    ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
              ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
               local_9f0);
    bVar2 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
            ::authored(&skel->restTransforms);
    if (bVar2) {
      bVar2 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
              ::get_value(&skel->restTransforms,
                          (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                           *)local_9f0);
      if (bVar2) goto LAB_004af284;
      ::std::__cxx11::ostringstream::ostringstream(local_b68);
      poVar3 = ::std::operator<<((ostream *)local_b68,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"BuildSkelHierarchy");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xbb2);
      ::std::operator<<(poVar3," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_ba8,"Failed to get Skeleton.restTransforms attrbitue: {}",&local_ba9);
      fmt::format<std::__cxx11::string>
                (local_b88,(string *)local_ba8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&skel->name);
      poVar3 = ::std::operator<<((ostream *)local_b68,(string *)local_b88);
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::string::~string((string *)local_b88);
      ::std::__cxx11::string::~string(local_ba8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_ba9);
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_bd0);
        ::std::__cxx11::string::~string(local_bd0);
      }
      skel_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_b68);
    }
    else {
      sVar4 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220);
      tinyusdz::value::matrix4d::identity();
      ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::assign
                ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 local_9f0,sVar4,&local_c50);
LAB_004af284:
      sVar4 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220);
      sVar7 = ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
              size((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                   local_9f0);
      if (sVar4 == sVar7) {
        ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
                  ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                   local_e58);
        bVar2 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                ::authored(&skel->bindTransforms);
        if (bVar2) {
          bVar2 = TypedAttribute<std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>_>
                  ::get_value(&skel->bindTransforms,
                              (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                               *)local_e58);
          if (bVar2) goto LAB_004af619;
          ::std::__cxx11::ostringstream::ostringstream(local_fd0);
          poVar3 = ::std::operator<<((ostream *)local_fd0,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"BuildSkelHierarchy");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xbc4);
          ::std::operator<<(poVar3," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_1010,"Failed to get Skeleton.bindTransforms attrbitue: {}",&local_1011);
          fmt::format<std::__cxx11::string>
                    (local_ff0,(string *)local_1010,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &skel->name);
          poVar3 = ::std::operator<<((ostream *)local_fd0,(string *)local_ff0);
          ::std::operator<<(poVar3,"\n");
          ::std::__cxx11::string::~string((string *)local_ff0);
          ::std::__cxx11::string::~string(local_1010);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1011);
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=((string *)err,local_1038);
            ::std::__cxx11::string::~string(local_1038);
          }
          skel_local._7_1_ = false;
          ::std::__cxx11::ostringstream::~ostringstream(local_fd0);
        }
        else {
          sVar4 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220)
          ;
          tinyusdz::value::matrix4d::identity();
          ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
          assign((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                 local_9f0,sVar4,&local_10b8);
LAB_004af619:
          sVar4 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220)
          ;
          sVar7 = ::std::
                  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
                  size((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                        *)local_e58);
          if (sVar4 == sVar7) {
            ::std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&nroots);
            bVar2 = BuildSkelTopology((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_220,(vector<int,_std::allocator<int>_> *)&nroots,err);
            if (bVar2) {
              iVar8 = ::std::vector<int,_std::allocator<int>_>::begin
                                ((vector<int,_std::allocator<int>_> *)&nroots);
              iVar9 = ::std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)&nroots);
              local_12c8 = (undefined1  [8])
                           ::std::
                           count_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,tinyusdz::tydra::BuildSkelHierarchy(tinyusdz::Skeleton_const&,tinyusdz::tydra::SkelNode&,std::__cxx11::string*)::__0>
                                     (iVar8._M_current,iVar9._M_current);
              if (local_12c8 == (undefined1  [8])0x0) {
                ::std::__cxx11::ostringstream::ostringstream(local_1458);
                poVar3 = ::std::operator<<((ostream *)local_1458,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"BuildSkelHierarchy");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xbdf);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1498,"Invalid Skel topology. No root joint found: {}",&local_1499);
                fmt::format<std::__cxx11::string>
                          (local_1478,(string *)local_1498,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &skel->name);
                poVar3 = ::std::operator<<((ostream *)local_1458,(string *)local_1478);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)local_1478);
                ::std::__cxx11::string::~string(local_1498);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1499);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_14c0);
                  ::std::__cxx11::string::~string(local_14c0);
                }
                skel_local._7_1_ = false;
                ::std::__cxx11::ostringstream::~ostringstream(local_1458);
              }
              else if (local_12c8 == (undefined1  [8])0x1) {
                ::std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::set((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&root.children.
                          super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                SkelNode::SkelNode((SkelNode *)&it);
                local_1840._M_current =
                     (int *)::std::vector<int,_std::allocator<int>_>::begin
                                      ((vector<int,_std::allocator<int>_> *)&nroots);
                local_1848 = (int *)::std::vector<int,_std::allocator<int>_>::end
                                              ((vector<int,_std::allocator<int>_> *)&nroots);
                local_184c = -1;
                local_1838 = ::std::
                             find<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                                       (local_1840,
                                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                         )local_1848,&local_184c);
                local_1858._M_current =
                     (int *)::std::vector<int,_std::allocator<int>_>::end
                                      ((vector<int,_std::allocator<int>_> *)&nroots);
                bVar2 = __gnu_cxx::operator==(&local_1838,&local_1858);
                if (bVar2) {
                  ::std::__cxx11::ostringstream::ostringstream(local_19d0);
                  poVar3 = ::std::operator<<((ostream *)local_19d0,"[error]");
                  poVar3 = ::std::operator<<(poVar3,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                            );
                  poVar3 = ::std::operator<<(poVar3,":");
                  poVar3 = ::std::operator<<(poVar3,"BuildSkelHierarchy");
                  poVar3 = ::std::operator<<(poVar3,"():");
                  poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xbef);
                  ::std::operator<<(poVar3," ");
                  poVar3 = ::std::operator<<((ostream *)local_19d0,"Internal error.");
                  ::std::operator<<(poVar3,"\n");
                  if (err != (string *)0x0) {
                    ::std::__cxx11::ostringstream::str();
                    ::std::__cxx11::string::operator+=((string *)err,(string *)&rootIdx);
                    ::std::__cxx11::string::~string((string *)&rootIdx);
                  }
                  skel_local._7_1_ = false;
                  ::std::__cxx11::ostringstream::~ostringstream(local_19d0);
                }
                else {
                  local_1a00 = (int *)::std::vector<int,_std::allocator<int>_>::begin
                                                ((vector<int,_std::allocator<int>_> *)&nroots);
                  local_1a08 = local_1838._M_current;
                  local_19f8 = ::std::
                               distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                                         ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                           )local_1a00,local_1838);
                  pvVar6 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                           operator[]((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_600,local_19f8);
                  psVar10 = Token::str_abi_cxx11_(pvVar6);
                  ::std::__cxx11::string::operator=
                            ((string *)(root.joint_path.field_2._M_local_buf + 8),(string *)psVar10)
                  ;
                  pvVar6 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                           operator[]((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_220,local_19f8);
                  psVar10 = Token::str_abi_cxx11_(pvVar6);
                  ::std::__cxx11::string::operator=((string *)&it,(string *)psVar10);
                  root.joint_name.field_2._8_4_ = (undefined4)local_19f8;
                  pvVar11 = ::std::
                            vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            ::operator[]((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                          *)local_e58,local_19f8);
                  memcpy(&root.joint_id,pvVar11,0x80);
                  pvVar11 = ::std::
                            vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            ::operator[]((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                          *)local_9f0,local_19f8);
                  memcpy(root.bind_transform.m[3] + 3,pvVar11,0x80);
                  ::std::
                  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
                  vector(&local_1a20,
                         (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          *)local_e58);
                  bVar2 = detail::BuildSkelHierarchyImpl
                                    ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                      *)&root.children.
                                         super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (SkelNode *)&it,(vector<int,_std::allocator<int>_> *)&nroots,
                                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                     local_220,
                                     (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                     local_600,&local_1a20,
                                     (vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                      *)local_9f0,err);
                  ::std::
                  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
                  ~vector(&local_1a20);
                  if (((bVar2 ^ 0xffU) & 1) == 0) {
                    SkelNode::operator=(dst,(SkelNode *)&it);
                    skel_local._7_1_ = true;
                  }
                  else {
                    skel_local._7_1_ = false;
                  }
                }
                SkelNode::~SkelNode((SkelNode *)&it);
                ::std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                ::~set((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&root.children.
                           super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1638);
                poVar3 = ::std::operator<<((ostream *)local_1638,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"BuildSkelHierarchy");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xbe6);
                ::std::operator<<(poVar3," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1678,
                           "Invalid Skel topology. Topology must be single-rooted, but it has {} roots: {}"
                           ,&local_1679);
                fmt::format<long,std::__cxx11::string>
                          (&local_1658,(fmt *)local_1678,(string *)local_12c8,(long *)&skel->name,
                           in_R8);
                poVar3 = ::std::operator<<((ostream *)local_1638,(string *)&local_1658);
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::string::~string((string *)&local_1658);
                ::std::__cxx11::string::~string(local_1678);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1679);
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=
                            ((string *)err,
                             (string *)&visitSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
                  ::std::__cxx11::string::~string
                            ((string *)&visitSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
                }
                skel_local._7_1_ = false;
                ::std::__cxx11::ostringstream::~ostringstream(local_1638);
              }
            }
            else {
              skel_local._7_1_ = false;
            }
            ::std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)&nroots);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_1230);
            poVar3 = ::std::operator<<((ostream *)local_1230,"[error]");
            poVar3 = ::std::operator<<(poVar3,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                      );
            poVar3 = ::std::operator<<(poVar3,":");
            poVar3 = ::std::operator<<(poVar3,"BuildSkelHierarchy");
            poVar3 = ::std::operator<<(poVar3,"():");
            poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xbcf);
            ::std::operator<<(poVar3," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1270,
                       "Skeleton.joints.size {} must be equal to Skeleton.bindTransforms.size {}: {}"
                       ,(allocator *)(local_1280 + 0xf));
            local_1280._0_8_ =
                 ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                           ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220);
            local_1288 = ::std::
                         vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                         ::size((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                 *)local_e58);
            fmt::format<unsigned_long,unsigned_long,std::__cxx11::string>
                      (&local_1250,(fmt *)local_1270,(string *)local_1280,&local_1288,
                       (unsigned_long *)&skel->name,in_R9);
            poVar3 = ::std::operator<<((ostream *)local_1230,(string *)&local_1250);
            ::std::operator<<(poVar3,"\n");
            ::std::__cxx11::string::~string((string *)&local_1250);
            ::std::__cxx11::string::~string(local_1270);
            ::std::allocator<char>::~allocator((allocator<char> *)(local_1280 + 0xf));
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=
                        ((string *)err,
                         (string *)
                         &parentJointIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &parentJointIds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
            }
            skel_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_1230);
          }
        }
        ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
        ~vector((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
                local_e58);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_dc8);
        poVar3 = ::std::operator<<((ostream *)local_dc8,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"BuildSkelHierarchy");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xbbd);
        ::std::operator<<(poVar3," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_e08,
                   "Skeleton.joints.size {} must be equal to Skeleton.restTransforms.size {}: {}",
                   (allocator *)(local_e18 + 0xf));
        local_e18._0_8_ =
             ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                       ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220);
        local_e20 = ::std::
                    vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
                    size((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          *)local_9f0);
        fmt::format<unsigned_long,unsigned_long,std::__cxx11::string>
                  (&local_de8,(fmt *)local_e08,(string *)local_e18,&local_e20,
                   (unsigned_long *)&skel->name,in_R9);
        poVar3 = ::std::operator<<((ostream *)local_dc8,(string *)&local_de8);
        ::std::operator<<(poVar3,"\n");
        ::std::__cxx11::string::~string((string *)&local_de8);
        ::std::__cxx11::string::~string(local_e08);
        ::std::allocator<char>::~allocator((allocator<char> *)(local_e18 + 0xf));
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=
                    ((string *)err,
                     (string *)
                     &bindTransforms.
                      super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          ::std::__cxx11::string::~string
                    ((string *)
                     &bindTransforms.
                      super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        skel_local._7_1_ = false;
        ::std::__cxx11::ostringstream::~ostringstream(local_dc8);
      }
    }
    ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::~vector
              ((vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *)
               local_9f0);
  }
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_600);
LAB_004afe91:
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_220);
  return skel_local._7_1_;
}

Assistant:

bool BuildSkelHierarchy(const Skeleton &skel, SkelNode &dst, std::string *err) {
  if (!skel.joints.authored()) {
    PUSH_ERROR_AND_RETURN(fmt::format(
        "Skeleton.joints attrbitue is not authored: {}", skel.name));
  }

  std::vector<value::token> joints;
  if (!skel.joints.get_value(&joints)) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Failed to get Skeleton.joints attrbitue: {}", skel.name));
  }

  if (joints.empty()) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Skeleton.joints attrbitue is empty: {}", skel.name));
  }

  std::vector<value::token> jointNames;

  if (skel.jointNames.authored()) {
    if (!skel.jointNames.get_value(&jointNames)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to get Skeleton.jointNames attrbitue: {}", skel.name));
    }

    if (joints.size() != jointNames.size()) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Skeleton.joints.size {} must be equal to "
                      "Skeleton.jointNames.size {}: {}",
                      joints.size(), jointNames.size(), skel.name));
    }
  } else {
    // Use joints 
    jointNames.resize(joints.size());
    for (size_t i = 0; i < joints.size(); i++) {
      jointNames[i] = joints[i];
    }
  }


  std::vector<value::matrix4d> restTransforms;
  if (skel.restTransforms.authored()) {
    if (!skel.restTransforms.get_value(&restTransforms)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to get Skeleton.restTransforms attrbitue: {}", skel.name));
    }
  } else {
    // TODO: Report error when `restTransforms` attribute is omitted?
    restTransforms.assign(joints.size(), value::matrix4d::identity());
  }

  if (joints.size() != restTransforms.size()) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Skeleton.joints.size {} must be equal to "
                    "Skeleton.restTransforms.size {}: {}",
                    joints.size(), restTransforms.size(), skel.name));
  }

  std::vector<value::matrix4d> bindTransforms;
  if (skel.bindTransforms.authored()) {
    if (!skel.bindTransforms.get_value(&bindTransforms)) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Failed to get Skeleton.bindTransforms attrbitue: {}", skel.name));
    }
  } else {
    // TODO: Report error when `restTransforms` attribute is omitted?
    restTransforms.assign(joints.size(), value::matrix4d::identity());
  }

  if (joints.size() != bindTransforms.size()) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Skeleton.joints.size {} must be equal to "
                    "Skeleton.bindTransforms.size {}: {}",
                    joints.size(), bindTransforms.size(), skel.name));
  }

  // Get flattened representation of joint hierarchy with BuildSkelTopology.
  // For root node, parentJointId = -1.
  std::vector<int> parentJointIds;
  if (!BuildSkelTopology(joints, parentJointIds, err)) {
    return false;
  }

  // Just in case. Chek if topology is single-rooted.
  auto nroots = std::count_if(parentJointIds.begin(), parentJointIds.end(),
                              [](int x) { return x == -1; });

  if (nroots == 0) {
    PUSH_ERROR_AND_RETURN(fmt::format(
        "Invalid Skel topology. No root joint found: {}", skel.name));
  }

  if (nroots != 1) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Invalid Skel topology. Topology must be single-rooted, "
                    "but it has {} roots: {}",
                    nroots, skel.name));
  }

  std::set<size_t> visitSet;

  SkelNode root;

  auto it = std::find(parentJointIds.begin(), parentJointIds.end(), -1);
  if (it == parentJointIds.end()) {
    PUSH_ERROR_AND_RETURN("Internal error.");
  }
  size_t rootIdx = size_t(std::distance(parentJointIds.begin(), it));

  root.joint_name = jointNames[rootIdx].str();
  root.joint_path = joints[rootIdx].str();
  root.joint_id = int(rootIdx);
  root.bind_transform = bindTransforms[rootIdx];
  root.rest_transform = restTransforms[rootIdx];

  DCOUT("parentJointIds = " << parentJointIds);
 
  // Construct hierachy from flattened id array.
  if (!detail::BuildSkelHierarchyImpl(visitSet, root, parentJointIds, joints, jointNames,
                                      bindTransforms, restTransforms,
                                      err)) {
    return false;
  }

  dst = root;

  return true;
}